

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall GameBoard::spawn_apple(GameBoard *this)

{
  pointer ppAVar1;
  Apple *this_00;
  Apple *local_18;
  
  ppAVar1 = (this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppAVar1) {
    (this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppAVar1 + -1;
  }
  this_00 = (Apple *)operator_new(0x10);
  Apple::Apple(this_00,this);
  local_18 = this_00;
  std::vector<Apple*,std::allocator<Apple*>>::emplace_back<Apple*>
            ((vector<Apple*,std::allocator<Apple*>> *)&this->apples,&local_18);
  return;
}

Assistant:

void GameBoard::spawn_apple() {
    if(!this->apples.empty()) {
        this->apples.pop_back();
    }
    this->apples.push_back(new Apple(this));
}